

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_upgrade_internal
              (nghttp2_session *session,uint8_t *settings_payload,size_t settings_payloadlen,
              void *stream_user_data)

{
  nghttp2_stream *local_b0;
  nghttp2_mem *mem;
  nghttp2_priority_spec pri_spec;
  int rv;
  size_t niv;
  nghttp2_settings_entry *iv;
  nghttp2_frame frame;
  nghttp2_stream *stream;
  void *stream_user_data_local;
  size_t settings_payloadlen_local;
  uint8_t *settings_payload_local;
  nghttp2_session *session_local;
  
  if (((session->server == '\0') && (session->next_stream_id != 1)) ||
     ((session->server != '\0' && (0 < session->last_recv_stream_id)))) {
    session_local._4_4_ = -0x1f9;
  }
  else if (settings_payloadlen % 6 == 0) {
    if (session->max_settings < settings_payloadlen / 6) {
      session_local._4_4_ = -0x219;
    }
    else {
      stream = (nghttp2_stream *)stream_user_data;
      stream_user_data_local = (void *)settings_payloadlen;
      settings_payloadlen_local = (size_t)settings_payload;
      settings_payload_local = (uint8_t *)session;
      pri_spec.weight =
           nghttp2_frame_unpack_settings_payload2
                     ((nghttp2_settings_entry **)&niv,(size_t *)&pri_spec.exclusive,settings_payload
                      ,settings_payloadlen,&session->mem);
      session_local._4_4_ = pri_spec.weight;
      if (pri_spec.weight == 0) {
        if (settings_payload_local[0xb1c] == '\0') {
          pri_spec.weight =
               nghttp2_submit_settings
                         ((nghttp2_session *)settings_payload_local,'\0',
                          (nghttp2_settings_entry *)niv,stack0xffffffffffffff78);
        }
        else {
          nghttp2_frame_hd_init
                    ((nghttp2_frame_hd *)&iv,(size_t)stream_user_data_local,'\x04','\0',0);
          frame.data.padlen = niv;
          frame._8_8_ = stack0xffffffffffffff78;
          pri_spec.weight =
               nghttp2_session_on_settings_received
                         ((nghttp2_session *)settings_payload_local,(nghttp2_frame *)&iv,1);
        }
        nghttp2_mem_free(&session->mem,(void *)niv);
        if (pri_spec.weight == 0) {
          nghttp2_priority_spec_default_init((nghttp2_priority_spec *)&mem);
          if (settings_payload_local[0xb1c] == '\0') {
            local_b0 = stream;
          }
          else {
            local_b0 = (nghttp2_stream *)0x0;
          }
          frame._56_8_ = nghttp2_session_open_stream
                                   ((nghttp2_session *)settings_payload_local,1,'\0',
                                    (nghttp2_priority_spec *)&mem,NGHTTP2_STREAM_OPENING,local_b0);
          if ((nghttp2_stream *)frame._56_8_ == (nghttp2_stream *)0x0) {
            session_local._4_4_ = -0x385;
          }
          else {
            if (settings_payload_local[0xb1c] == '\0') {
              nghttp2_stream_shutdown((nghttp2_stream *)frame._56_8_,NGHTTP2_SHUT_WR);
              settings_payload_local[0xa9c] = '\x01';
              settings_payload_local[0xa9d] = '\0';
              settings_payload_local[0xa9e] = '\0';
              settings_payload_local[0xa9f] = '\0';
              *(int *)(settings_payload_local + 0xa98) =
                   *(int *)(settings_payload_local + 0xa98) + 2;
            }
            else {
              nghttp2_stream_shutdown((nghttp2_stream *)frame._56_8_,NGHTTP2_SHUT_RD);
              settings_payload_local[0xaa0] = '\x01';
              settings_payload_local[0xaa1] = '\0';
              settings_payload_local[0xaa2] = '\0';
              settings_payload_local[0xaa3] = '\0';
              settings_payload_local[0xaa4] = '\x01';
              settings_payload_local[0xaa5] = '\0';
              settings_payload_local[0xaa6] = '\0';
              settings_payload_local[0xaa7] = '\0';
            }
            session_local._4_4_ = 0;
          }
        }
        else {
          session_local._4_4_ = pri_spec.weight;
        }
      }
    }
  }
  else {
    session_local._4_4_ = -0x1f5;
  }
  return session_local._4_4_;
}

Assistant:

static int nghttp2_session_upgrade_internal(nghttp2_session *session,
                                            const uint8_t *settings_payload,
                                            size_t settings_payloadlen,
                                            void *stream_user_data) {
  nghttp2_stream *stream;
  nghttp2_frame frame;
  nghttp2_settings_entry *iv;
  size_t niv;
  int rv;
  nghttp2_priority_spec pri_spec;
  nghttp2_mem *mem;

  mem = &session->mem;

  if ((!session->server && session->next_stream_id != 1) ||
      (session->server && session->last_recv_stream_id >= 1)) {
    return NGHTTP2_ERR_PROTO;
  }
  if (settings_payloadlen % NGHTTP2_FRAME_SETTINGS_ENTRY_LENGTH) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }
  /* SETTINGS frame contains too many settings */
  if (settings_payloadlen / NGHTTP2_FRAME_SETTINGS_ENTRY_LENGTH >
      session->max_settings) {
    return NGHTTP2_ERR_TOO_MANY_SETTINGS;
  }
  rv = nghttp2_frame_unpack_settings_payload2(&iv, &niv, settings_payload,
                                              settings_payloadlen, mem);
  if (rv != 0) {
    return rv;
  }

  if (session->server) {
    nghttp2_frame_hd_init(&frame.hd, settings_payloadlen, NGHTTP2_SETTINGS,
                          NGHTTP2_FLAG_NONE, 0);
    frame.settings.iv = iv;
    frame.settings.niv = niv;
    rv = nghttp2_session_on_settings_received(session, &frame, 1 /* No ACK */);
  } else {
    rv = nghttp2_submit_settings(session, NGHTTP2_FLAG_NONE, iv, niv);
  }
  nghttp2_mem_free(mem, iv);
  if (rv != 0) {
    return rv;
  }

  nghttp2_priority_spec_default_init(&pri_spec);

  stream = nghttp2_session_open_stream(
      session, 1, NGHTTP2_STREAM_FLAG_NONE, &pri_spec, NGHTTP2_STREAM_OPENING,
      session->server ? NULL : stream_user_data);
  if (stream == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  /* We don't call nghttp2_session_adjust_closed_stream(), since this
     should be the first stream open. */

  if (session->server) {
    nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_RD);
    session->last_recv_stream_id = 1;
    session->last_proc_stream_id = 1;
  } else {
    nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_WR);
    session->last_sent_stream_id = 1;
    session->next_stream_id += 2;
  }
  return 0;
}